

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_sat_one_mdd(MDD mdd)

{
  uint32_t value;
  mddnode_t n_00;
  uint64_t mdd_00;
  MDD ifeq;
  MDD down;
  mddnode_t n;
  MDD mdd_local;
  
  if (mdd == 0) {
    mdd_local = 0;
  }
  else if (mdd == 1) {
    mdd_local = 1;
  }
  else {
    n_00 = LDD_GETNODE(mdd);
    mdd_00 = mddnode_getdown(n_00);
    ifeq = lddmc_sat_one_mdd(mdd_00);
    value = mddnode_getvalue(n_00);
    mdd_local = lddmc_makenode(value,ifeq,0);
  }
  return mdd_local;
}

Assistant:

MDD
lddmc_sat_one_mdd(MDD mdd)
{
    if (mdd == lddmc_false) return lddmc_false;
    if (mdd == lddmc_true) return lddmc_true;
    mddnode_t n = LDD_GETNODE(mdd);
    MDD down = lddmc_sat_one_mdd(mddnode_getdown(n));
    return lddmc_makenode(mddnode_getvalue(n), down, lddmc_false);
}